

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * linearize_function_call_expression
                   (Proc *proc,AstNode *expr,AstNode *callsite_expr,Pseudo *callsite_pseudo)

{
  int i_00;
  AstNodeList *head;
  long lVar1;
  Proc *pPVar2;
  Instruction *insn_00;
  Constant *pCVar3;
  Pseudo *pPVar4;
  Instruction *pIVar5;
  Pseudo *pPVar6;
  Proc *apPStack_e0 [4];
  Instruction *local_c0;
  Pseudo *local_b8;
  Pseudo *tofree;
  Pseudo *pPStack_a8;
  int i;
  Pseudo *return_pseudo;
  Pseudo *arg_pseudo;
  PtrListIterator argiter__;
  int argi;
  Pseudo **tofreelist;
  AstNode *pAStack_68;
  int argc;
  AstNode *arg;
  Pseudo *tofree2;
  Pseudo *tofree1;
  Pseudo *temp;
  Pseudo *name_pseudo;
  Constant *name_constant;
  Pseudo *self_arg;
  Instruction *insn;
  Pseudo *callsite_pseudo_local;
  AstNode *callsite_expr_local;
  AstNode *expr_local;
  Proc *proc_local;
  
  apPStack_e0[0] = (Proc *)0x125820;
  insn_00 = allocate_instruction(proc,op_call,expr->line_number);
  name_constant = (Constant *)0x0;
  insn = (Instruction *)callsite_pseudo;
  if ((expr->field_2).function_stmt.function_expr != (AstNode *)0x0) {
    apPStack_e0[0] = (Proc *)0x125848;
    pCVar3 = allocate_string_constant(proc,(expr->field_2).function_call_expr.method_name);
    apPStack_e0[0] = (Proc *)0x125859;
    pPVar4 = allocate_constant_pseudo(proc,pCVar3);
    insn = (Instruction *)
           instruct_indexed_load
                     (proc,(callsite_expr->field_2).common_expr.type.type_code,callsite_pseudo,
                      RAVI_TSTRING,pPVar4,RAVI_TANY,expr->line_number);
    name_constant = (Constant *)callsite_pseudo;
  }
  if (((undefined1  [40])*insn & (undefined1  [40])0xf) == (undefined1  [40])0x4) {
    apPStack_e0[0] = (Proc *)0x1258f8;
    check_pseudo_is_top(proc,(Pseudo *)insn);
  }
  else {
    apPStack_e0[0] = (Proc *)0x1258bf;
    pIVar5 = (Instruction *)allocate_temp_pseudo(proc,RAVI_TANY,true);
    apPStack_e0[0] = (Proc *)0x1258e1;
    instruct_move(proc,op_mov,(Pseudo *)pIVar5,(Pseudo *)insn,expr->line_number);
    insn = pIVar5;
  }
  apPStack_e0[0] = (Proc *)0x125909;
  pPVar4 = add_instruction_operand(proc,insn_00,(Pseudo *)insn);
  arg = (AstNode *)0x0;
  if (name_constant != (Constant *)0x0) {
    apPStack_e0[0] = (Proc *)0x12592d;
    arg = (AstNode *)add_instruction_operand(proc,insn_00,(Pseudo *)name_constant);
  }
  apPStack_e0[0] = (Proc *)0x12593e;
  tofreelist._4_4_ = raviX_ptrlist_size((PtrList *)(expr->field_2).for_stmt.for_statement_list);
  lVar1 = -((long)tofreelist._4_4_ * 8 + 0xfU & 0xfffffffffffffff0);
  argiter__._20_4_ = 0;
  head = (expr->field_2).for_stmt.for_statement_list;
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125979;
  raviX_ptrlist_forward_iterator((PtrListIterator *)&arg_pseudo,(PtrList *)head);
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125985;
  pAStack_68 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&arg_pseudo);
  while (pAStack_68 != (AstNode *)0x0) {
    tofreelist._4_4_ = tofreelist._4_4_ + -1;
    *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x1259aa;
    pPVar6 = linearize_expression(proc,pAStack_68);
    return_pseudo = pPVar6;
    if ((tofreelist._4_4_ != 0) &&
       (((undefined1  [48])*pPVar6 & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
      *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x1259d4;
      convert_range_to_temp(pPVar6);
    }
    pPVar6 = return_pseudo;
    *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x1259e8;
    pPVar6 = add_instruction_operand(proc,insn_00,pPVar6);
    *(Pseudo **)((long)apPStack_e0 + (long)(int)argiter__._20_4_ * 8 + lVar1 + -0xd8 + 0xe0) =
         pPVar6;
    argiter__._20_4_ = argiter__._20_4_ + 1;
    *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125a0d;
    pAStack_68 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&arg_pseudo);
  }
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125a23;
  pPVar6 = allocate_range_pseudo(proc,(Pseudo *)insn);
  pPStack_a8 = pPVar6;
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125a3e;
  add_instruction_target(proc,insn_00,pPVar6);
  i_00 = (expr->field_2).function_call_expr.num_results;
  apPStack_e0[2] = proc;
  apPStack_e0[3] = proc;
  local_c0 = insn_00;
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125a6f;
  pCVar3 = allocate_integer_constant(proc,i_00);
  pPVar2 = apPStack_e0[2];
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125a7e;
  pPVar6 = allocate_constant_pseudo(pPVar2,pCVar3);
  pIVar5 = local_c0;
  pPVar2 = apPStack_e0[3];
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125a94;
  add_instruction_target(pPVar2,pIVar5,pPVar6);
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125aa1;
  add_instruction(proc,insn_00);
  *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125aae;
  free_instruction_operand_pseudos(proc,insn_00);
  if (pPVar4 != (Pseudo *)0x0) {
    *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125ac4;
    free_temp_pseudo(proc,pPVar4,false);
  }
  if (arg != (AstNode *)0x0) {
    *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125ada;
    free_temp_pseudo(proc,(Pseudo *)arg,false);
  }
  for (tofree._4_4_ = 0; tofree._4_4_ < (int)argiter__._20_4_; tofree._4_4_ = tofree._4_4_ + 1) {
    pPVar4 = *(Pseudo **)((long)apPStack_e0 + (long)tofree._4_4_ * 8 + lVar1 + -0xd8 + 0xe0);
    if (pPVar4 != (Pseudo *)0x0) {
      local_b8 = pPVar4;
      *(undefined8 *)((long)apPStack_e0 + lVar1) = 0x125b21;
      free_temp_pseudo(proc,pPVar4,false);
    }
  }
  return pPStack_a8;
}

Assistant:

static Pseudo *linearize_function_call_expression(Proc *proc, AstNode *expr,
							 AstNode *callsite_expr, Pseudo *callsite_pseudo)
{
	Instruction *insn = allocate_instruction(proc, op_call, expr->line_number);

	Pseudo *self_arg = NULL; /* For method call */
	if (expr->function_call_expr.method_name) {
		const Constant *name_constant =
		    allocate_string_constant(proc, expr->function_call_expr.method_name);
		Pseudo *name_pseudo = allocate_constant_pseudo(proc, name_constant);
		self_arg = callsite_pseudo; /* The original callsite must be passed as 'self' */
		/* create new call site as callsite[name] */
		callsite_pseudo = instruct_indexed_load(proc, callsite_expr->common_expr.type.type_code,
							callsite_pseudo, RAVI_TSTRING, name_pseudo, RAVI_TANY, expr->line_number);
	}

	// callsite needs to be at the top of the stack and also must be a temp
	if (callsite_pseudo->type != PSEUDO_TEMP_ANY) {
		Pseudo *temp = allocate_temp_pseudo(proc, RAVI_TANY, true);
		instruct_move(proc, op_mov, temp, callsite_pseudo, expr->line_number);
		callsite_pseudo = temp;
	}
	else {
		// assert that the pseudo is at the top
		check_pseudo_is_top(proc, callsite_pseudo);
	}

	Pseudo *tofree1 = add_instruction_operand(proc, insn, callsite_pseudo);
	Pseudo *tofree2 = NULL;
	if (self_arg) {
		tofree2 = add_instruction_operand(proc, insn, self_arg);
	}

	// add the args
	AstNode *arg;
	int argc = raviX_ptrlist_size((const PtrList *)expr->function_call_expr.arg_list);
	Pseudo **tofreelist = (Pseudo **) alloca(argc * sizeof(Pseudo *));
	int argi = 0;
	FOR_EACH_PTR(expr->function_call_expr.arg_list, AstNode, arg)
	{
		argc -= 1;
		Pseudo *arg_pseudo = linearize_expression(proc, arg);
		if (argc != 0 && arg_pseudo->type == PSEUDO_RANGE) {
			// Not last one, so range can only be 1
			convert_range_to_temp(arg_pseudo);
		}
		tofreelist[argi++] = add_instruction_operand(proc, insn, arg_pseudo);
	}
	END_FOR_EACH_PTR(arg)

	Pseudo *return_pseudo = allocate_range_pseudo(
	    proc, callsite_pseudo); /* Base reg for function call - where return values will be placed */
	add_instruction_target(proc, insn, return_pseudo);
	add_instruction_target(proc, insn, allocate_constant_pseudo(proc, allocate_integer_constant(proc, expr->function_call_expr.num_results)));
	add_instruction(proc, insn);

	free_instruction_operand_pseudos(proc, insn);
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	for (int i = 0; i < argi; i++) {
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return return_pseudo;
}